

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder.h
# Opt level: O3

NodeRef __thiscall
embree::avx::BVHNBuilderVirtual<8>::
BVHNBuilderT<embree::avx::CreateLeaf<8,_embree::TriangleMv<4>_>_>::createLeaf
          (BVHNBuilderT<embree::avx::CreateLeaf<8,_embree::TriangleMv<4>_>_> *this,PrimRef *prims,
          range<unsigned_long> *set,Allocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  undefined4 *puVar2;
  undefined4 *puVar3;
  pointer *pppTVar4;
  uint uVar5;
  uint uVar6;
  undefined4 uVar7;
  FastAllocator *this_00;
  ThreadLocal *pTVar8;
  ThreadLocal2 *pTVar9;
  iterator __position;
  Ref<embree::Geometry> *pRVar10;
  Geometry *pGVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined8 uVar18;
  ulong uVar19;
  char *pcVar20;
  undefined1 (*pauVar21) [16];
  size_t sVar22;
  ulong uVar23;
  long lVar24;
  unsigned_long uVar25;
  long lVar26;
  uint *puVar27;
  ulong uVar28;
  long lVar29;
  undefined1 auVar30 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar31 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  vuint<4> vgeomID;
  vuint<4> vprimID;
  undefined1 local_108 [16];
  ulong local_f8;
  PrimRef *local_f0;
  ThreadLocal2 *local_e8;
  undefined1 uStack_e0;
  undefined7 uStack_df;
  undefined1 auStack_d8 [16];
  undefined1 auStack_c8 [16];
  ThreadLocal2 *local_b8;
  char cStack_b0;
  undefined7 uStack_af;
  undefined1 auStack_a8 [16];
  undefined1 auStack_98 [16];
  long local_88;
  BVHNBuilderT<embree::avx::CreateLeaf<8,_embree::TriangleMv<4>_>_> *local_80;
  ThreadLocal2 *local_78;
  undefined8 uStack_70;
  undefined1 auStack_68 [16];
  undefined1 auStack_58 [16];
  undefined1 local_48 [16];
  
  auVar34 = in_ZMM3._0_16_;
  auVar31 = in_ZMM1._0_16_;
  uVar25 = set->_begin;
  uVar19 = (set->_end - uVar25) + 3;
  local_f8 = uVar19 >> 2;
  this_00 = alloc->alloc;
  pTVar8 = alloc->talloc1;
  local_108._8_8_ = local_108._0_8_;
  local_108._0_8_ = local_f8 * 0xb0;
  pTVar9 = pTVar8->parent;
  local_f0 = prims;
  if (this_00 != (pTVar9->alloc)._M_b._M_p) {
    cStack_b0 = '\x01';
    local_b8 = pTVar9;
    MutexSys::lock(&pTVar9->mutex);
    if ((pTVar9->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((pTVar9->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar9->alloc1).bytesUsed + (pTVar9->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar9->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((pTVar9->alloc0).end + (pTVar9->alloc1).end) -
           ((pTVar9->alloc0).cur + (pTVar9->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar9->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar9->alloc1).bytesWasted + (pTVar9->alloc0).bytesWasted;
      UNLOCK();
    }
    auVar30 = ZEXT1632(ZEXT816(0) << 0x40);
    (pTVar9->alloc0).end = auVar30._0_8_;
    (pTVar9->alloc0).allocBlockSize = auVar30._8_8_;
    (pTVar9->alloc0).bytesUsed = auVar30._16_8_;
    (pTVar9->alloc0).bytesWasted = auVar30._24_8_;
    (pTVar9->alloc0).ptr = (char *)auVar30._0_8_;
    (pTVar9->alloc0).cur = auVar30._8_8_;
    (pTVar9->alloc0).end = auVar30._16_8_;
    (pTVar9->alloc0).allocBlockSize = auVar30._24_8_;
    auVar30 = ZEXT1632(ZEXT816(0) << 0x40);
    if (this_00 == (FastAllocator *)0x0) {
      (pTVar9->alloc1).end = auVar30._0_8_;
      (pTVar9->alloc1).allocBlockSize = auVar30._8_8_;
      (pTVar9->alloc1).bytesUsed = auVar30._16_8_;
      (pTVar9->alloc1).bytesWasted = auVar30._24_8_;
      (pTVar9->alloc1).ptr = (char *)auVar30._0_8_;
      (pTVar9->alloc1).cur = auVar30._8_8_;
      (pTVar9->alloc1).end = auVar30._16_8_;
      (pTVar9->alloc1).allocBlockSize = auVar30._24_8_;
    }
    else {
      (pTVar9->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (pTVar9->alloc1).ptr = (char *)auVar30._0_8_;
      (pTVar9->alloc1).cur = auVar30._8_8_;
      (pTVar9->alloc1).end = auVar30._16_8_;
      (pTVar9->alloc1).allocBlockSize = auVar30._24_8_;
      (pTVar9->alloc1).end = auVar30._0_8_;
      (pTVar9->alloc1).allocBlockSize = auVar30._8_8_;
      (pTVar9->alloc1).bytesUsed = auVar30._16_8_;
      (pTVar9->alloc1).bytesWasted = auVar30._24_8_;
      (pTVar9->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (pTVar9->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_e8 = (ThreadLocal2 *)&FastAllocator::s_thread_local_allocators_lock;
    uStack_e0 = 1;
    in_ZMM1 = ZEXT1664(auVar31);
    in_ZMM3 = ZEXT1664(auVar34);
    local_78 = pTVar9;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (this_00->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this_00->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&this_00->thread_local_allocators,__position,&local_78);
    }
    else {
      *__position._M_current = pTVar9;
      pppTVar4 = &(this_00->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar4 = *pppTVar4 + 1;
    }
    MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    if (cStack_b0 == '\x01') {
      MutexSys::unlock(&local_b8->mutex);
    }
  }
  uVar18 = local_108._0_8_;
  pTVar8->bytesUsed = (long)&((MutexSys *)local_108._0_8_)->mutex + pTVar8->bytesUsed;
  sVar22 = pTVar8->cur;
  uVar23 = (ulong)(-(int)sVar22 & 0xf);
  uVar28 = (long)&((MutexSys *)local_108._0_8_)->mutex + uVar23 + sVar22;
  pTVar8->cur = uVar28;
  if (pTVar8->end < uVar28) {
    pTVar8->cur = sVar22;
    pTVar9 = (ThreadLocal2 *)pTVar8->allocBlockSize;
    if ((ThreadLocal2 *)(local_108._0_8_ * 4) < pTVar9 || local_108._0_8_ * 4 - (long)pTVar9 == 0) {
      local_e8 = pTVar9;
      pcVar20 = (char *)FastAllocator::malloc(this_00,(size_t)&local_e8);
      pTVar8->ptr = pcVar20;
      sVar22 = (pTVar8->end - pTVar8->cur) + pTVar8->bytesWasted;
      pTVar8->bytesWasted = sVar22;
      pTVar8->end = (size_t)local_e8;
      pTVar8->cur = uVar18;
      if (local_e8 < (ulong)uVar18) {
        pTVar8->cur = 0;
        local_e8 = (ThreadLocal2 *)pTVar8->allocBlockSize;
        pcVar20 = (char *)FastAllocator::malloc(this_00,(size_t)&local_e8);
        pTVar8->ptr = pcVar20;
        sVar22 = (pTVar8->end - pTVar8->cur) + pTVar8->bytesWasted;
        pTVar8->bytesWasted = sVar22;
        pTVar8->end = (size_t)local_e8;
        pTVar8->cur = uVar18;
        if (local_e8 < (ulong)uVar18) {
          pTVar8->cur = 0;
          pcVar20 = (char *)0x0;
          goto LAB_012a7bcb;
        }
      }
      pTVar8->bytesWasted = sVar22;
    }
    else {
      pcVar20 = (char *)FastAllocator::malloc(this_00,(size_t)local_108);
    }
  }
  else {
    pTVar8->bytesWasted = pTVar8->bytesWasted + uVar23;
    pcVar20 = pTVar8->ptr + (uVar28 - local_108._0_8_);
  }
LAB_012a7bcb:
  if (3 < uVar19) {
    lVar26 = local_f8 + (local_f8 == 0);
    local_f0 = (PrimRef *)((long)&(local_f0->upper).field_0 + 0xc);
    lVar24 = 0;
    local_e8 = (ThreadLocal2 *)0x0;
    pTVar9 = local_e8;
    local_88 = lVar26;
    local_80 = this;
    do {
      uVar19 = set->_end;
      local_48 = vpcmpeqd_avx(in_ZMM1._0_16_,in_ZMM1._0_16_);
      auStack_c8 = (undefined1  [16])0x0;
      uStack_e0 = 0;
      uStack_df = 0;
      auStack_d8 = (undefined1  [16])0x0;
      auStack_98 = (undefined1  [16])0x0;
      auStack_a8 = (undefined1  [16])0x0;
      auStack_58 = (undefined1  [16])0x0;
      uStack_70 = 0;
      auStack_68 = (undefined1  [16])0x0;
      auVar31 = ZEXT816(0) << 0x40;
      if (uVar25 < uVar19) {
        pRVar10 = (((this->createLeafFunc).bvh)->scene->geometries).items;
        puVar27 = (uint *)((long)local_f0 + uVar25 * 0x20);
        uVar28 = 0;
        local_108 = local_48;
        local_e8 = pTVar9;
        local_b8 = pTVar9;
        cStack_b0 = uStack_e0;
        uStack_af = uStack_df;
        local_78 = pTVar9;
        do {
          uVar5 = puVar27[-4];
          uVar6 = *puVar27;
          pGVar11 = pRVar10[uVar5].ptr;
          lVar29 = (ulong)uVar6 *
                   pGVar11[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
          lVar26 = *(long *)&pGVar11->field_0x58;
          lVar12 = *(long *)&pGVar11[1].time_range.upper;
          p_Var13 = pGVar11[1].intersectionFilterN;
          puVar2 = (undefined4 *)(lVar12 + (ulong)*(uint *)(lVar26 + lVar29) * (long)p_Var13);
          uVar7 = puVar2[1];
          uVar14 = puVar2[2];
          auVar31 = *(undefined1 (*) [16])
                     (lVar12 + (ulong)*(uint *)(lVar26 + 4 + lVar29) * (long)p_Var13);
          puVar3 = (undefined4 *)(lVar12 + (ulong)*(uint *)(lVar26 + 8 + lVar29) * (long)p_Var13);
          uVar15 = *puVar3;
          uVar16 = puVar3[1];
          uVar17 = puVar3[2];
          *(undefined4 *)((long)&local_e8 + uVar28 * 4) = *puVar2;
          *(undefined4 *)(auStack_d8 + uVar28 * 4) = uVar7;
          *(undefined4 *)(auStack_c8 + uVar28 * 4) = uVar14;
          *(int *)((long)&local_b8 + uVar28 * 4) = auVar31._0_4_;
          uVar7 = vextractps_avx(auVar31,1);
          *(undefined4 *)(auStack_a8 + uVar28 * 4) = uVar7;
          uVar7 = vextractps_avx(auVar31,2);
          *(undefined4 *)(auStack_98 + uVar28 * 4) = uVar7;
          *(undefined4 *)((long)&local_78 + uVar28 * 4) = uVar15;
          *(undefined4 *)(auStack_68 + uVar28 * 4) = uVar16;
          *(undefined4 *)(auStack_58 + uVar28 * 4) = uVar17;
          *(uint *)(local_108 + uVar28 * 4) = uVar5;
          *(uint *)(local_48 + uVar28 * 4) = uVar6;
          uVar23 = uVar28 + 1;
          if (2 < uVar28) break;
          lVar26 = uVar28 + uVar25;
          puVar27 = puVar27 + 8;
          uVar28 = uVar23;
        } while (lVar26 + 1U < uVar19);
        auVar34[8] = uStack_e0;
        auVar34._0_8_ = local_e8;
        auVar34._9_7_ = uStack_df;
        auVar33[8] = cStack_b0;
        auVar33._0_8_ = local_b8;
        auVar33._9_7_ = uStack_af;
        auVar32._8_8_ = uStack_70;
        auVar32._0_8_ = local_78;
        uVar25 = uVar25 + uVar23;
        lVar26 = local_88;
        this = local_80;
        auVar31 = auStack_58;
      }
      else {
        local_108 = vpcmpeqd_avx(in_ZMM3._0_16_,in_ZMM3._0_16_);
        auStack_68 = ZEXT816(0) << 0x40;
        auVar32 = ZEXT816(0) << 0x40;
        auStack_98 = ZEXT816(0) << 0x40;
        auStack_a8 = ZEXT816(0) << 0x40;
        auVar33 = ZEXT816(0) << 0x40;
        auStack_c8 = ZEXT816(0) << 0x40;
        auStack_d8 = ZEXT816(0) << 0x40;
        auVar34 = ZEXT816(0) << 0x40;
      }
      in_ZMM3 = ZEXT1664(local_108);
      in_ZMM1 = ZEXT1664(local_48);
      pauVar21 = (undefined1 (*) [16])(pcVar20 + lVar24 * 0xb0);
      auVar34 = vmovntps_avx(auVar34);
      *pauVar21 = auVar34;
      auVar34 = vmovntps_avx(auStack_d8);
      pauVar21[1] = auVar34;
      auVar34 = vmovntps_avx(auStack_c8);
      pauVar21[2] = auVar34;
      auVar34 = vmovntps_avx(auVar33);
      pauVar21[3] = auVar34;
      auVar34 = vmovntps_avx(auStack_a8);
      pauVar21[4] = auVar34;
      auVar34 = vmovntps_avx(auStack_98);
      pauVar21[5] = auVar34;
      auVar34 = vmovntps_avx(auVar32);
      pauVar21[6] = auVar34;
      auVar34 = vmovntps_avx(auStack_68);
      pauVar21[7] = auVar34;
      auVar31 = vmovntps_avx(auVar31);
      pauVar21[8] = auVar31;
      auVar31 = vmovntdq_avx(local_108);
      pauVar21[9] = auVar31;
      auVar31 = vmovntdq_avx(local_48);
      pauVar21[10] = auVar31;
      lVar24 = lVar24 + 1;
    } while (lVar24 != lVar26);
  }
  uVar19 = 7;
  if (local_f8 < 7) {
    uVar19 = local_f8;
  }
  return (NodeRef)(uVar19 | (ulong)pcVar20 | 8);
}

Assistant:

NodeRef createLeaf (const PrimRef* prims, const range<size_t>& set, const Allocator& alloc) {
            return createLeafFunc(prims,set,alloc);
          }